

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

void av1_rc_postencode_update_drop_frame(AV1_COMP *cpi)

{
  int iVar1;
  
  update_buffer_level(cpi,0);
  (cpi->rc).rc_1_frame = 0;
  (cpi->rc).rc_2_frame = 0;
  (cpi->rc).prev_avg_frame_bandwidth = (cpi->rc).avg_frame_bandwidth;
  iVar1 = (cpi->common).height;
  (cpi->rc).prev_coded_width = (cpi->common).width;
  (cpi->rc).prev_coded_height = iVar1;
  (cpi->rc).prev_frame_is_dropped = 1;
  if ((cpi->rc).high_source_sad != 0) {
    (cpi->rc).avg_source_sad = 0;
  }
  if ((cpi->ppi->use_svc != 0) && (1 < (cpi->svc).number_spatial_layers)) {
    iVar1 = (cpi->svc).spatial_layer_id;
    (cpi->svc).last_layer_dropped[iVar1] = true;
    (cpi->svc).drop_spatial_layer[iVar1] = true;
  }
  iVar1 = (cpi->svc).number_spatial_layers;
  if ((cpi->svc).spatial_layer_id == iVar1 + -1) {
    (cpi->svc).prev_number_spatial_layers = iVar1;
  }
  (cpi->svc).prev_number_temporal_layers = (cpi->svc).number_temporal_layers;
  return;
}

Assistant:

void av1_rc_postencode_update_drop_frame(AV1_COMP *cpi) {
  // Update buffer level with zero size, update frame counters, and return.
  update_buffer_level(cpi, 0);
  cpi->rc.rc_2_frame = 0;
  cpi->rc.rc_1_frame = 0;
  cpi->rc.prev_avg_frame_bandwidth = cpi->rc.avg_frame_bandwidth;
  cpi->rc.prev_coded_width = cpi->common.width;
  cpi->rc.prev_coded_height = cpi->common.height;
  cpi->rc.prev_frame_is_dropped = 1;
  // On a scene/slide change for dropped frame: reset the avg_source_sad to 0,
  // otherwise the avg_source_sad can get too large and subsequent frames
  // may miss the scene/slide detection.
  if (cpi->rc.high_source_sad) cpi->rc.avg_source_sad = 0;
  if (cpi->ppi->use_svc && cpi->svc.number_spatial_layers > 1) {
    cpi->svc.last_layer_dropped[cpi->svc.spatial_layer_id] = true;
    cpi->svc.drop_spatial_layer[cpi->svc.spatial_layer_id] = true;
  }
  if (cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1) {
    cpi->svc.prev_number_spatial_layers = cpi->svc.number_spatial_layers;
  }
  cpi->svc.prev_number_temporal_layers = cpi->svc.number_temporal_layers;
}